

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterRenameColumn(Parse *pParse,SrcList *pSrc,Token *pOld,Token *pNew)

{
  byte bVar1;
  short sVar2;
  sqlite3 *db;
  Schema *pSVar3;
  int iVar4;
  int iVar5;
  Table *pTab;
  char *pcVar6;
  Parse *pPVar7;
  char *p;
  Schema **ppSVar8;
  Column *pCVar9;
  char *pcVar10;
  ulong uVar11;
  
  db = pParse->db;
  pTab = sqlite3LocateTableItem(pParse,0,pSrc->a);
  if ((pTab == (Table *)0x0) || (iVar4 = isAlterableTable(pParse,pTab), iVar4 != 0)) {
LAB_001695d3:
    sqlite3SrcListDelete(db,pSrc);
    return;
  }
  if (pTab->nModuleArg != 0 || pTab->pSelect != (Select *)0x0) {
    pcVar10 = "view";
    if (pTab->pSelect == (Select *)0x0) {
      pcVar10 = (char *)0x0;
    }
    pcVar6 = "virtual table";
    if (pTab->nModuleArg == 0) {
      pcVar6 = pcVar10;
    }
    sqlite3ErrorMsg(pParse,"cannot rename columns of %s \"%s\"",pcVar6,pTab->zName);
    goto LAB_001695d3;
  }
  if (pTab->pSchema == (Schema *)0x0) {
    iVar4 = -1000000;
  }
  else {
    iVar4 = -1;
    ppSVar8 = &db->aDb->pSchema;
    do {
      iVar4 = iVar4 + 1;
      pSVar3 = *ppSVar8;
      ppSVar8 = ppSVar8 + 4;
    } while (pSVar3 != pTab->pSchema);
  }
  pcVar10 = db->aDb[iVar4].zDbSName;
  iVar5 = sqlite3AuthCheck(pParse,0x1a,pcVar10,pTab->zName,(char *)0x0);
  if ((iVar5 != 0) || (pcVar6 = sqlite3NameFromToken(db,pOld), pcVar6 == (char *)0x0))
  goto LAB_001695d3;
  sVar2 = pTab->nCol;
  if (sVar2 < 1) {
    uVar11 = 0;
LAB_00169654:
    if ((uint)uVar11 != (int)sVar2) {
      pPVar7 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar7 = pParse;
      }
      pPVar7->mayAbort = '\x01';
      p = sqlite3NameFromToken(db,pNew);
      if (p == (char *)0x0) {
        p = (char *)0x0;
      }
      else {
        bVar1 = ""[(byte)*pNew->z];
        sqlite3NestedParse(pParse,
                           "UPDATE \"%w\".%s SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) WHERE name NOT LIKE \'sqlite_%%\' AND (type != \'index\' OR tbl_name = %Q) AND sql NOT LIKE \'create virtual%%\'"
                           ,pcVar10,"sqlite_master",pcVar10,pTab->zName,uVar11,p,
                           (ulong)(bVar1 & 0xffffff80),(ulong)(iVar4 == 1),pTab->zName);
        sqlite3NestedParse(pParse,
                           "UPDATE temp.%s SET sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) WHERE type IN (\'trigger\', \'view\')"
                           ,"sqlite_master",pcVar10,pTab->zName,uVar11 & 0xffffffff,p,
                           (ulong)(bVar1 & 0xffffff80));
        renameReloadSchema(pParse,iVar4);
        renameTestSchema(pParse,pcVar10,(uint)(iVar4 == 1));
      }
      goto LAB_00169772;
    }
  }
  else {
    pCVar9 = pTab->aCol;
    uVar11 = 0;
    do {
      iVar5 = sqlite3StrICmp(pCVar9->zName,pcVar6);
      if (iVar5 == 0) goto LAB_00169654;
      uVar11 = uVar11 + 1;
      pCVar9 = pCVar9 + 1;
    } while ((uint)(int)sVar2 != uVar11);
  }
  p = (char *)0x0;
  sqlite3ErrorMsg(pParse,"no such column: \"%s\"",pcVar6);
LAB_00169772:
  sqlite3SrcListDelete(db,pSrc);
  sqlite3DbFreeNN(db,pcVar6);
  if (p == (char *)0x0) {
    return;
  }
  sqlite3DbFreeNN(db,p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterRenameColumn(
  Parse *pParse,                  /* Parsing context */
  SrcList *pSrc,                  /* Table being altered.  pSrc->nSrc==1 */
  Token *pOld,                    /* Name of column being changed */
  Token *pNew                     /* New column name */
){
  sqlite3 *db = pParse->db;       /* Database connection */
  Table *pTab;                    /* Table being updated */
  int iCol;                       /* Index of column being renamed */
  char *zOld = 0;                 /* Old column name */
  char *zNew = 0;                 /* New column name */
  const char *zDb;                /* Name of schema containing the table */
  int iSchema;                    /* Index of the schema */
  int bQuote;                     /* True to quote the new name */

  /* Locate the table to be altered */
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_rename_column;

  /* Cannot alter a system table */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_rename_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab) ) goto exit_rename_column;

  /* Which schema holds the table to be altered */  
  iSchema = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iSchema>=0 );
  zDb = db->aDb[iSchema].zDbSName;

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    goto exit_rename_column;
  }
#endif

  /* Make sure the old name really is a column name in the table to be
  ** altered.  Set iCol to be the index of the column being renamed */
  zOld = sqlite3NameFromToken(db, pOld);
  if( !zOld ) goto exit_rename_column;
  for(iCol=0; iCol<pTab->nCol; iCol++){
    if( 0==sqlite3StrICmp(pTab->aCol[iCol].zName, zOld) ) break;
  }
  if( iCol==pTab->nCol ){
    sqlite3ErrorMsg(pParse, "no such column: \"%s\"", zOld);
    goto exit_rename_column;
  }

  /* Do the rename operation using a recursive UPDATE statement that
  ** uses the sqlite_rename_column() SQL function to compute the new
  ** CREATE statement text for the sqlite_master table.
  */
  sqlite3MayAbort(pParse);
  zNew = sqlite3NameFromToken(db, pNew);
  if( !zNew ) goto exit_rename_column;
  assert( pNew->n>0 );
  bQuote = sqlite3Isquote(pNew->z[0]);
  sqlite3NestedParse(pParse, 
      "UPDATE \"%w\".%s SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, %d) "
      "WHERE name NOT LIKE 'sqlite_%%' AND (type != 'index' OR tbl_name = %Q)"
      " AND sql NOT LIKE 'create virtual%%'",
      zDb, MASTER_NAME, 
      zDb, pTab->zName, iCol, zNew, bQuote, iSchema==1,
      pTab->zName
  );

  sqlite3NestedParse(pParse, 
      "UPDATE temp.%s SET "
      "sql = sqlite_rename_column(sql, type, name, %Q, %Q, %d, %Q, %d, 1) "
      "WHERE type IN ('trigger', 'view')",
      MASTER_NAME, 
      zDb, pTab->zName, iCol, zNew, bQuote
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iSchema);
  renameTestSchema(pParse, zDb, iSchema==1);

 exit_rename_column:
  sqlite3SrcListDelete(db, pSrc);
  sqlite3DbFree(db, zOld);
  sqlite3DbFree(db, zNew);
  return;
}